

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_sdm_mips64el(CPUMIPSState_conflict5 *env,target_ulong addr,target_ulong reglist,
                        uint32_t mem_idx)

{
  ulong uVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  
  uVar2 = (uint)reglist & 0xf;
  if ((ulong)uVar2 - 1 < 9) {
    for (uVar1 = 0; uVar2 << 2 != uVar1; uVar1 = uVar1 + 4) {
      cpu_stq_mmuidx_ra_mips64el
                ((CPUArchState_conflict14 *)env,addr,
                 (env->active_tc).gpr[*(int *)((long)multiple_regs + uVar1)],mem_idx,unaff_retaddr);
      addr = addr + 8;
    }
  }
  if ((reglist & 0x10) != 0) {
    cpu_stq_mmuidx_ra_mips64el
              ((CPUArchState_conflict14 *)env,addr,(env->active_tc).gpr[0x1f],mem_idx,unaff_retaddr)
    ;
    return;
  }
  return;
}

Assistant:

void helper_sdm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            cpu_stq_mmuidx_ra(env, addr, env->active_tc.gpr[multiple_regs[i]],
                              mem_idx, GETPC());
            addr += 8;
        }
    }

    if (do_r31) {
        cpu_stq_mmuidx_ra(env, addr, env->active_tc.gpr[31], mem_idx, GETPC());
    }
}